

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O2

bool __thiscall
boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
unsynchronized_pop<depspawn::internal::TaskPool::Task*>
          (queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>> *this,
          Task **ret)

{
  uint uVar1;
  index_t index;
  index_t index_00;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  index_t iVar5;
  
  do {
    while( true ) {
      uVar1 = *(uint *)this;
      index_00 = (index_t)uVar1;
      puVar3 = (uint *)((ulong)((uVar1 & 0xffff) << 6) + *(long *)(this + 0x80));
      if (index_00 == *(index_t *)(this + 0x88)) {
        puVar3 = (uint *)0x0;
      }
      uVar2 = *puVar3 & 0xffff;
      puVar4 = (uint *)((ulong)(uVar2 << 6) + *(long *)(this + 0x80));
      if ((index_t)*puVar3 == *(index_t *)(this + 0x88)) {
        puVar4 = (uint *)0x0;
      }
      iVar5 = (index_t)*(uint *)(this + 0x40);
      if (index_00 != iVar5) break;
      if (puVar4 == (uint *)0x0) goto LAB_0010ec1c;
      LOCK();
      *(uint *)(this + 0x40) = uVar2 + (*(uint *)(this + 0x40) & 0xffff0000) + 0x10000;
      UNLOCK();
    }
  } while (puVar4 == (uint *)0x0);
  *ret = *(Task **)(puVar4 + 2);
  LOCK();
  *(uint *)this = (uVar1 & 0xffff0000) + uVar2 + 0x10000;
  UNLOCK();
  detail::
  fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
  ::deallocate_impl_unsafe
            ((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
              *)(this + 0x80),index_00);
LAB_0010ec1c:
  return index_00 != iVar5;
}

Assistant:

bool unsynchronized_pop (U & ret)
    {
        for (;;) {
            tagged_node_handle head = head_.load(memory_order_relaxed);
            node * head_ptr = pool.get_pointer(head);
            tagged_node_handle tail = tail_.load(memory_order_relaxed);
            tagged_node_handle next = head_ptr->next.load(memory_order_relaxed);
            node * next_ptr = pool.get_pointer(next);

            if (pool.get_handle(head) == pool.get_handle(tail)) {
                if (next_ptr == 0)
                    return false;

                tagged_node_handle new_tail(pool.get_handle(next), tail.get_next_tag());
                tail_.store(new_tail);
            } else {
                if (next_ptr == 0)
                    /* this check is not part of the original algorithm as published by michael and scott
                     *
                     * however we reuse the tagged_ptr part for the freelist and clear the next part during node
                     * allocation. we can observe a null-pointer here.
                     * */
                    continue;
                detail::copy_payload(next_ptr->data, ret);
                tagged_node_handle new_head(pool.get_handle(next), head.get_next_tag());
                head_.store(new_head);
                pool.template destruct<false>(head);
                return true;
            }
        }
    }